

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13ad8::verifyPixelsAreEqual<half>
               (DeepImageChannel *c1,DeepImageChannel *c2,int dx,int dy)

{
  uint uVar1;
  long lVar2;
  ImageLevel *this;
  Box2i *pBVar3;
  DeepImageLevel *pDVar4;
  uint *puVar5;
  ArgExc *pAVar6;
  half *phVar7;
  half *phVar8;
  undefined8 in_RSI;
  ImageChannel *in_RDI;
  float fVar9;
  int i;
  half *s2;
  half *s1;
  int n2;
  int n1;
  int x;
  int y;
  SampleCountChannel *scc2;
  SampleCountChannel *scc1;
  Box2i *dataWindow;
  TypedDeepImageChannel<half> *tc2;
  TypedDeepImageChannel<half> *tc1;
  int in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  SampleCountChannel *in_stack_ffffffffffffff80;
  int local_64;
  int local_48;
  int local_44;
  
  lVar2 = __dynamic_cast(in_RDI,&Imf_2_5::DeepImageChannel::typeinfo,
                         &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  lVar2 = __dynamic_cast(in_RSI,&Imf_2_5::DeepImageChannel::typeinfo,
                         &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  this = Imf_2_5::ImageChannel::level(in_RDI);
  pBVar3 = Imf_2_5::ImageLevel::dataWindow(this);
  pDVar4 = Imf_2_5::DeepImageChannel::deepLevel((DeepImageChannel *)0x11ed5e);
  Imf_2_5::DeepImageLevel::sampleCounts(pDVar4);
  pDVar4 = Imf_2_5::DeepImageChannel::deepLevel((DeepImageChannel *)0x11ed78);
  Imf_2_5::DeepImageLevel::sampleCounts(pDVar4);
  local_44 = (pBVar3->min).y;
  do {
    if ((pBVar3->max).y < local_44) {
      return;
    }
    for (local_48 = (pBVar3->min).x; local_48 <= (pBVar3->max).x; local_48 = local_48 + 1) {
      puVar5 = Imf_2_5::SampleCountChannel::at
                         (in_stack_ffffffffffffff80,(int)in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
      uVar1 = *puVar5;
      puVar5 = Imf_2_5::SampleCountChannel::at
                         (in_stack_ffffffffffffff80,(int)in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
      if (uVar1 != *puVar5) {
        pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar6,"different pixel sample counts");
        __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      phVar7 = Imf_2_5::TypedDeepImageChannel<half>::at
                         ((TypedDeepImageChannel<half> *)in_stack_ffffffffffffff80,
                          (int)in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      phVar8 = Imf_2_5::TypedDeepImageChannel<half>::at
                         ((TypedDeepImageChannel<half> *)in_stack_ffffffffffffff80,
                          (int)in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      for (local_64 = 0; local_64 < (int)uVar1; local_64 = local_64 + 1) {
        in_stack_ffffffffffffff7c = half::operator_cast_to_float(phVar7 + local_64);
        fVar9 = half::operator_cast_to_float(phVar8 + local_64);
        if ((in_stack_ffffffffffffff7c != fVar9) || (NAN(in_stack_ffffffffffffff7c) || NAN(fVar9)))
        {
          pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar6,"different sample values");
          __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual
    (const DeepImageChannel &c1,
     const DeepImageChannel &c2,
     int dx,
     int dy)
{
    const TypedDeepImageChannel<T> &tc1 =
        dynamic_cast <const TypedDeepImageChannel<T>&> (c1);

    const TypedDeepImageChannel<T> &tc2 =
        dynamic_cast <const TypedDeepImageChannel<T>&> (c2);

    const Box2i &dataWindow = c1.level().dataWindow();
    const SampleCountChannel &scc1 = c1.deepLevel().sampleCounts();
    const SampleCountChannel &scc2 = c2.deepLevel().sampleCounts();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n1 = scc1.at (x, y);
            int n2 = scc2.at (x + dx, y + dy);

            if (n1 != n2)
                throw ArgExc ("different pixel sample counts");

            const T* s1 = tc1.at (x, y);
            const T* s2 = tc2.at (x + dx, y + dy);

            for (int i = 0; i < n1; ++i)
                if (s1[i] != s2[i])
                    throw ArgExc ("different sample values");
        }
    }
}